

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Functional::TestGroup::init(TestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestNode *pTVar2;
  Context *this_00;
  TestCaseGroup *attCombTests;
  TestGroup *this_local;
  
  this_00 = &this->m_fboc;
  pTVar1 = &deqp::gls::fboc::details::Context::createAttachmentTests(this_00)->super_TestNode;
  pTVar2 = &deqp::gls::fboc::details::Context::createRenderableTests(this_00)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  SupportedCombinationTest::SupportedCombinationTest
            ((SupportedCombinationTest *)pTVar2,this_00,"exists_supported",
             "Test for existence of a supported combination of formats");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &deqp::gls::fboc::details::Context::createSizeTests(&this->m_fboc)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void TestGroup::init (void)
{
	tcu::TestCaseGroup* attCombTests = m_fboc.createAttachmentTests();
	addChild(m_fboc.createRenderableTests());
	attCombTests->addChild(new SupportedCombinationTest(
							   m_fboc,
							   "exists_supported",
							   "Test for existence of a supported combination of formats"));
	addChild(attCombTests);
	addChild(m_fboc.createSizeTests());
}